

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

bool CoreML::Specification::ImageFeatureType_ColorSpace_IsValid(int value)

{
  return (bool)((byte)(0x10040100401 >> ((byte)value & 0x3f)) & (uint)value < 0x29);
}

Assistant:

bool ImageFeatureType_ColorSpace_IsValid(int value) {
  switch (value) {
    case 0:
    case 10:
    case 20:
    case 30:
    case 40:
      return true;
    default:
      return false;
  }
}